

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Stream::~Stream(Stream *this)

{
  Stream *this_local;
  
  std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::~unique_ptr
            (&this->CurrentDoc);
  std::unique_ptr<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>::~unique_ptr
            (&this->scanner);
  return;
}

Assistant:

Stream::~Stream() = default;